

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spherei_intersector.h
# Opt level: O2

void embree::avx2::SphereMiIntersectorK<8,_8,_true>::intersect
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *sphere)

{
  float fVar1;
  float fVar2;
  float fVar3;
  byte bVar4;
  Geometry *pGVar5;
  long lVar6;
  __int_type_conflict _Var7;
  RTCFilterFunctionN p_Var8;
  float fVar9;
  float fVar10;
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  uint uVar20;
  uint uVar21;
  int iVar22;
  Scene *pSVar23;
  ulong uVar24;
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined4 uVar35;
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [16];
  undefined1 auVar41 [32];
  undefined1 auVar43 [36];
  float fVar44;
  float fVar47;
  float fVar48;
  float fVar49;
  undefined1 auVar45 [32];
  undefined1 auVar46 [64];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [64];
  undefined1 auVar53 [32];
  undefined1 auVar55 [32];
  undefined1 auVar57 [32];
  undefined1 in_ZMM8 [64];
  undefined1 in_ZMM9 [64];
  undefined1 auVar59 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [28];
  undefined1 auVar64 [64];
  undefined1 auVar65 [28];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [32];
  undefined1 auVar70 [64];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  SphereIntersectorHitM<8> hit;
  HitK<8> h;
  RTCFilterFunctionNArguments local_430;
  undefined1 local_400 [32];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1b0 [16];
  uint local_1a0 [4];
  uint uStack_190;
  uint uStack_18c;
  uint uStack_188;
  uint uStack_184;
  undefined4 local_180;
  undefined4 uStack_17c;
  undefined4 uStack_178;
  undefined4 uStack_174;
  undefined4 uStack_170;
  undefined4 uStack_16c;
  undefined4 uStack_168;
  undefined4 uStack_164;
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  uint local_e0;
  uint uStack_dc;
  uint uStack_d8;
  uint uStack_d4;
  uint uStack_d0;
  uint uStack_cc;
  uint uStack_c8;
  uint uStack_c4;
  uint local_c0;
  uint uStack_bc;
  uint uStack_b8;
  uint uStack_b4;
  uint uStack_b0;
  uint uStack_ac;
  uint uStack_a8;
  uint uStack_a4;
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  undefined1 auVar42 [64];
  undefined1 auVar54 [64];
  undefined1 auVar56 [64];
  undefined1 auVar58 [64];
  undefined1 auVar60 [32];
  undefined1 auVar63 [32];
  
  pSVar23 = context->scene;
  local_1a0[0] = sphere->sharedGeomID;
  pGVar5 = (pSVar23->geometries).items[local_1a0[0]].ptr;
  lVar6 = *(long *)&pGVar5->field_0x58;
  _Var7 = pGVar5[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar28._16_16_ = *(undefined1 (*) [16])(lVar6 + (sphere->primIDs).field_0.i[4] * _Var7);
  auVar28._0_16_ = *(undefined1 (*) [16])(lVar6 + (sphere->primIDs).field_0.i[0] * _Var7);
  auVar30._16_16_ = *(undefined1 (*) [16])(lVar6 + (sphere->primIDs).field_0.i[5] * _Var7);
  auVar30._0_16_ = *(undefined1 (*) [16])(lVar6 + (sphere->primIDs).field_0.i[1] * _Var7);
  auVar39._16_16_ = *(undefined1 (*) [16])(lVar6 + (sphere->primIDs).field_0.i[6] * _Var7);
  auVar39._0_16_ = *(undefined1 (*) [16])(lVar6 + (sphere->primIDs).field_0.i[2] * _Var7);
  auVar41._16_16_ = *(undefined1 (*) [16])(lVar6 + (sphere->primIDs).field_0.i[7] * _Var7);
  auVar41._0_16_ = *(undefined1 (*) [16])(lVar6 + (sphere->primIDs).field_0.i[3] * _Var7);
  auVar57 = vunpcklps_avx(auVar28,auVar39);
  auVar32 = vunpckhps_avx(auVar28,auVar39);
  auVar39 = vunpcklps_avx(auVar30,auVar41);
  auVar28 = vunpckhps_avx(auVar30,auVar41);
  auVar69 = vunpcklps_avx(auVar57,auVar39);
  auVar57 = vunpckhps_avx(auVar57,auVar39);
  auVar39 = vunpcklps_avx(auVar32,auVar28);
  auVar30 = vunpckhps_avx(auVar32,auVar28);
  bVar4 = sphere->numPrimitives;
  auVar25._1_3_ = 0;
  auVar25[0] = bVar4;
  auVar25[4] = bVar4;
  auVar25._5_3_ = 0;
  auVar25[8] = bVar4;
  auVar25._9_3_ = 0;
  auVar25[0xc] = bVar4;
  auVar25._13_3_ = 0;
  auVar25[0x10] = bVar4;
  auVar25._17_3_ = 0;
  auVar25[0x14] = bVar4;
  auVar25._21_3_ = 0;
  auVar25[0x18] = bVar4;
  auVar25._25_3_ = 0;
  auVar25[0x1c] = bVar4;
  auVar25._29_3_ = 0;
  auVar25 = vpcmpgtd_avx2(auVar25,_DAT_01fb4ba0);
  local_1a0[1] = local_1a0[0];
  local_1a0[2] = local_1a0[0];
  local_1a0[3] = local_1a0[0];
  uStack_190 = local_1a0[0];
  uStack_18c = local_1a0[0];
  uStack_188 = local_1a0[0];
  uStack_184 = local_1a0[0];
  uVar35 = *(undefined4 *)(ray + k * 4);
  auVar50._4_4_ = uVar35;
  auVar50._0_4_ = uVar35;
  auVar50._8_4_ = uVar35;
  auVar50._12_4_ = uVar35;
  auVar50._16_4_ = uVar35;
  auVar50._20_4_ = uVar35;
  auVar50._24_4_ = uVar35;
  auVar50._28_4_ = uVar35;
  auVar28 = vsubps_avx(auVar69,auVar50);
  uVar35 = *(undefined4 *)(ray + k * 4 + 0x20);
  auVar51._4_4_ = uVar35;
  auVar51._0_4_ = uVar35;
  auVar51._8_4_ = uVar35;
  auVar51._12_4_ = uVar35;
  auVar51._16_4_ = uVar35;
  auVar51._20_4_ = uVar35;
  auVar51._24_4_ = uVar35;
  auVar51._28_4_ = uVar35;
  auVar57 = vsubps_avx(auVar57,auVar51);
  uVar35 = *(undefined4 *)(ray + k * 4 + 0x40);
  auVar36._4_4_ = uVar35;
  auVar36._0_4_ = uVar35;
  auVar36._8_4_ = uVar35;
  auVar36._12_4_ = uVar35;
  auVar36._16_4_ = uVar35;
  auVar36._20_4_ = uVar35;
  auVar36._24_4_ = uVar35;
  auVar36._28_4_ = uVar35;
  fVar1 = *(float *)(ray + k * 4 + 0x80);
  auVar60._4_4_ = fVar1;
  auVar60._0_4_ = fVar1;
  auVar60._8_4_ = fVar1;
  auVar60._12_4_ = fVar1;
  auVar60._16_4_ = fVar1;
  auVar60._20_4_ = fVar1;
  auVar60._24_4_ = fVar1;
  auVar60._28_4_ = fVar1;
  auVar61 = ZEXT3264(auVar60);
  fVar2 = *(float *)(ray + k * 4 + 0xa0);
  auVar63._4_4_ = fVar2;
  auVar63._0_4_ = fVar2;
  auVar63._8_4_ = fVar2;
  auVar63._12_4_ = fVar2;
  auVar63._16_4_ = fVar2;
  auVar63._20_4_ = fVar2;
  auVar63._24_4_ = fVar2;
  auVar63._28_4_ = fVar2;
  auVar64 = ZEXT3264(auVar63);
  fVar3 = *(float *)(ray + k * 4 + 0xc0);
  auVar66 = ZEXT3264(CONCAT428(fVar3,CONCAT424(fVar3,CONCAT420(fVar3,CONCAT416(fVar3,CONCAT412(fVar3
                                                  ,CONCAT48(fVar3,CONCAT44(fVar3,fVar3))))))));
  auVar39 = vsubps_avx(auVar39,auVar36);
  auVar40 = vfmadd231ps_fma(ZEXT432((uint)(fVar3 * fVar3)),auVar63,auVar63);
  auVar40 = vfmadd231ps_fma(ZEXT1632(auVar40),auVar60,auVar60);
  uVar35 = auVar40._0_4_;
  auVar45._4_4_ = uVar35;
  auVar45._0_4_ = uVar35;
  auVar45._8_4_ = uVar35;
  auVar45._12_4_ = uVar35;
  auVar45._16_4_ = uVar35;
  auVar45._20_4_ = uVar35;
  auVar45._24_4_ = uVar35;
  auVar45._28_4_ = uVar35;
  auVar32 = vrcpps_avx(auVar45);
  auVar37._8_4_ = 0x3f800000;
  auVar37._0_8_ = 0x3f8000003f800000;
  auVar37._12_4_ = 0x3f800000;
  auVar37._16_4_ = 0x3f800000;
  auVar37._20_4_ = 0x3f800000;
  auVar37._24_4_ = 0x3f800000;
  auVar37._28_4_ = 0x3f800000;
  auVar40 = vfnmadd231ps_fma(auVar37,auVar32,auVar45);
  auVar40 = vfmadd132ps_fma(ZEXT1632(auVar40),auVar32,auVar32);
  auVar69._4_4_ = fVar3 * auVar39._4_4_;
  auVar69._0_4_ = fVar3 * auVar39._0_4_;
  auVar69._8_4_ = fVar3 * auVar39._8_4_;
  auVar69._12_4_ = fVar3 * auVar39._12_4_;
  auVar69._16_4_ = fVar3 * auVar39._16_4_;
  auVar69._20_4_ = fVar3 * auVar39._20_4_;
  auVar69._24_4_ = fVar3 * auVar39._24_4_;
  auVar69._28_4_ = uVar35;
  auVar13 = vfmadd231ps_fma(auVar69,auVar57,auVar63);
  auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar28,auVar60);
  fVar44 = auVar13._0_4_ * auVar40._0_4_;
  fVar47 = auVar13._4_4_ * auVar40._4_4_;
  fVar48 = auVar13._8_4_ * auVar40._8_4_;
  fVar49 = auVar13._12_4_ * auVar40._12_4_;
  auVar14._4_4_ = fVar1 * fVar47;
  auVar14._0_4_ = fVar1 * fVar44;
  auVar14._8_4_ = fVar1 * fVar48;
  auVar14._12_4_ = fVar1 * fVar49;
  auVar14._16_4_ = fVar1 * 0.0;
  auVar14._20_4_ = fVar1 * 0.0;
  auVar14._24_4_ = fVar1 * 0.0;
  auVar14._28_4_ = auVar32._28_4_;
  auVar68._0_4_ = fVar2 * fVar44;
  auVar68._4_4_ = fVar2 * fVar47;
  auVar68._8_4_ = fVar2 * fVar48;
  auVar68._12_4_ = fVar2 * fVar49;
  auVar68._16_4_ = fVar2 * 0.0;
  auVar68._20_4_ = fVar2 * 0.0;
  auVar68._28_36_ = in_ZMM8._28_36_;
  auVar68._24_4_ = fVar2 * 0.0;
  auVar70._0_4_ = fVar3 * fVar44;
  auVar70._4_4_ = fVar3 * fVar47;
  auVar70._8_4_ = fVar3 * fVar48;
  auVar70._12_4_ = fVar3 * fVar49;
  auVar70._16_4_ = fVar3 * 0.0;
  auVar70._20_4_ = fVar3 * 0.0;
  auVar70._28_36_ = in_ZMM9._28_36_;
  auVar70._24_4_ = fVar3 * 0.0;
  auVar69 = vsubps_avx(auVar28,auVar14);
  auVar67 = ZEXT3264(auVar69);
  auVar57 = vsubps_avx(auVar57,auVar68._0_32_);
  auVar68 = ZEXT3264(auVar57);
  auVar39 = vsubps_avx(auVar39,auVar70._0_32_);
  auVar70 = ZEXT3264(auVar39);
  auVar32._4_4_ = auVar39._4_4_ * auVar39._4_4_;
  auVar32._0_4_ = auVar39._0_4_ * auVar39._0_4_;
  auVar32._8_4_ = auVar39._8_4_ * auVar39._8_4_;
  auVar32._12_4_ = auVar39._12_4_ * auVar39._12_4_;
  auVar32._16_4_ = auVar39._16_4_ * auVar39._16_4_;
  auVar32._20_4_ = auVar39._20_4_ * auVar39._20_4_;
  auVar32._24_4_ = auVar39._24_4_ * auVar39._24_4_;
  auVar32._28_4_ = auVar28._28_4_;
  auVar13 = vfmadd231ps_fma(auVar32,auVar57,auVar57);
  auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar69,auVar69);
  auVar15._4_4_ = auVar30._4_4_ * auVar30._4_4_;
  auVar15._0_4_ = auVar30._0_4_ * auVar30._0_4_;
  auVar15._8_4_ = auVar30._8_4_ * auVar30._8_4_;
  auVar15._12_4_ = auVar30._12_4_ * auVar30._12_4_;
  auVar15._16_4_ = auVar30._16_4_ * auVar30._16_4_;
  auVar15._20_4_ = auVar30._20_4_ * auVar30._20_4_;
  auVar15._24_4_ = auVar30._24_4_ * auVar30._24_4_;
  auVar15._28_4_ = auVar30._28_4_;
  auVar32 = vcmpps_avx(ZEXT1632(auVar13),auVar15,2);
  auVar28 = auVar25 & auVar32;
  if ((((((((auVar28 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar28 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar28 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar28 >> 0x7f,0) != '\0') ||
        (auVar28 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar28 >> 0xbf,0) != '\0') ||
      (auVar28 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar28[0x1f] < '\0') {
    auVar32 = vandps_avx(auVar32,auVar25);
    auVar12 = vpackssdw_avx(auVar32._0_16_,auVar32._16_16_);
    auVar32 = vsubps_avx(auVar15,ZEXT1632(auVar13));
    auVar16._4_4_ = auVar40._4_4_ * auVar32._4_4_;
    auVar16._0_4_ = auVar40._0_4_ * auVar32._0_4_;
    auVar16._8_4_ = auVar40._8_4_ * auVar32._8_4_;
    auVar16._12_4_ = auVar40._12_4_ * auVar32._12_4_;
    auVar16._16_4_ = auVar32._16_4_ * 0.0;
    auVar16._20_4_ = auVar32._20_4_ * 0.0;
    auVar16._24_4_ = auVar32._24_4_ * 0.0;
    auVar16._28_4_ = auVar32._28_4_;
    auVar30 = vsqrtps_avx(auVar16);
    auVar52 = ZEXT3264(auVar30);
    auVar25 = vsubps_avx(ZEXT1632(CONCAT412(fVar49,CONCAT48(fVar48,CONCAT44(fVar47,fVar44)))),
                         auVar30);
    auVar53._0_4_ = fVar44 + auVar30._0_4_;
    auVar53._4_4_ = fVar47 + auVar30._4_4_;
    auVar53._8_4_ = fVar48 + auVar30._8_4_;
    auVar53._12_4_ = fVar49 + auVar30._12_4_;
    auVar53._16_4_ = auVar30._16_4_ + 0.0;
    auVar53._20_4_ = auVar30._20_4_ + 0.0;
    auVar53._24_4_ = auVar30._24_4_ + 0.0;
    auVar53._28_4_ = auVar30._28_4_ + 0.0;
    auVar54 = ZEXT3264(auVar53);
    uVar35 = *(undefined4 *)(ray + k * 4 + 0x60);
    auVar38._4_4_ = uVar35;
    auVar38._0_4_ = uVar35;
    auVar38._8_4_ = uVar35;
    auVar38._12_4_ = uVar35;
    auVar38._16_4_ = uVar35;
    auVar38._20_4_ = uVar35;
    auVar38._24_4_ = uVar35;
    auVar38._28_4_ = uVar35;
    auVar32 = vcmpps_avx(auVar38,auVar25,2);
    uVar35 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar55._4_4_ = uVar35;
    auVar55._0_4_ = uVar35;
    auVar55._8_4_ = uVar35;
    auVar55._12_4_ = uVar35;
    auVar55._16_4_ = uVar35;
    auVar55._20_4_ = uVar35;
    auVar55._24_4_ = uVar35;
    auVar55._28_4_ = uVar35;
    auVar56 = ZEXT3264(auVar55);
    auVar28 = vcmpps_avx(auVar25,auVar55,2);
    auVar32 = vandps_avx(auVar32,auVar28);
    auVar40 = vpackssdw_avx(auVar32._0_16_,auVar32._16_16_);
    local_3d0 = vpand_avx(auVar40,auVar12);
    auVar32 = vcmpps_avx(auVar38,auVar53,2);
    auVar28 = vcmpps_avx(auVar53,auVar55,2);
    auVar32 = vandps_avx(auVar32,auVar28);
    auVar40 = vpackssdw_avx(auVar32._0_16_,auVar32._16_16_);
    local_1b0 = vpand_avx(auVar40,auVar12);
    auVar40 = vpor_avx(local_3d0,local_1b0);
    local_400 = vpmovsxwd_avx2(auVar40);
    if ((((((((local_400 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (local_400 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_400 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(local_400 >> 0x7f,0) != '\0') ||
          (local_400 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(local_400 >> 0xbf,0) != '\0') ||
        (local_400 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_400[0x1f] < '\0') {
      auVar28 = vpmovsxwd_avx2(local_3d0);
      local_340 = vblendvps_avx(auVar53,auVar25,auVar28);
      auVar31._0_8_ = auVar30._0_8_ ^ 0x8000000080000000;
      auVar31._8_4_ = -auVar30._8_4_;
      auVar31._12_4_ = -auVar30._12_4_;
      auVar31._16_4_ = -auVar30._16_4_;
      auVar31._20_4_ = -auVar30._20_4_;
      auVar31._24_4_ = -auVar30._24_4_;
      auVar31._28_4_ = -auVar30._28_4_;
      auVar32 = vblendvps_avx(auVar30,auVar31,auVar28);
      fVar44 = auVar32._0_4_;
      fVar47 = auVar32._4_4_;
      auVar17._4_4_ = fVar1 * fVar47;
      auVar17._0_4_ = fVar1 * fVar44;
      fVar48 = auVar32._8_4_;
      auVar17._8_4_ = fVar1 * fVar48;
      fVar49 = auVar32._12_4_;
      auVar17._12_4_ = fVar1 * fVar49;
      fVar9 = auVar32._16_4_;
      auVar17._16_4_ = fVar1 * fVar9;
      fVar10 = auVar32._20_4_;
      auVar17._20_4_ = fVar1 * fVar10;
      fVar11 = auVar32._24_4_;
      auVar17._24_4_ = fVar1 * fVar11;
      auVar17._28_4_ = 0x80000000;
      auVar18._4_4_ = fVar2 * fVar47;
      auVar18._0_4_ = fVar2 * fVar44;
      auVar18._8_4_ = fVar2 * fVar48;
      auVar18._12_4_ = fVar2 * fVar49;
      auVar18._16_4_ = fVar2 * fVar9;
      auVar18._20_4_ = fVar2 * fVar10;
      auVar18._24_4_ = fVar2 * fVar11;
      auVar18._28_4_ = auVar28._28_4_;
      auVar19._4_4_ = fVar3 * fVar47;
      auVar19._0_4_ = fVar3 * fVar44;
      auVar19._8_4_ = fVar3 * fVar48;
      auVar19._12_4_ = fVar3 * fVar49;
      auVar19._16_4_ = fVar3 * fVar9;
      auVar19._20_4_ = fVar3 * fVar10;
      auVar19._24_4_ = fVar3 * fVar11;
      auVar19._28_4_ = auVar32._28_4_;
      local_320 = vsubps_avx(auVar17,auVar69);
      local_300 = vsubps_avx(auVar18,auVar57);
      local_2e0 = vsubps_avx(auVar19,auVar39);
      auVar46 = ZEXT3264(local_340);
      auVar32 = vpmovzxwd_avx2(auVar40);
      auVar32 = vpslld_avx2(auVar32,0x1f);
      auVar57._8_4_ = 0x7f800000;
      auVar57._0_8_ = 0x7f8000007f800000;
      auVar57._12_4_ = 0x7f800000;
      auVar57._16_4_ = 0x7f800000;
      auVar57._20_4_ = 0x7f800000;
      auVar57._24_4_ = 0x7f800000;
      auVar57._28_4_ = 0x7f800000;
      auVar58 = ZEXT3264(auVar57);
      auVar32 = vblendvps_avx(auVar57,local_340,auVar32);
      auVar28 = vshufps_avx(auVar32,auVar32,0xb1);
      auVar28 = vminps_avx(auVar32,auVar28);
      auVar57 = vshufpd_avx(auVar28,auVar28,5);
      auVar28 = vminps_avx(auVar28,auVar57);
      auVar39 = vpermpd_avx2(auVar28,0x4e);
      auVar28 = vminps_avx(auVar28,auVar39);
      auVar28 = vcmpps_avx(auVar32,auVar28,0);
      auVar57 = local_400 & auVar28;
      auVar32 = local_400;
      if ((((((((auVar57 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar57 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar57 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar57 >> 0x7f,0) != '\0') ||
            (auVar57 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar57 >> 0xbf,0) != '\0') ||
          (auVar57 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar57[0x1f] < '\0') {
        auVar32 = vandps_avx(auVar28,local_400);
      }
      uVar20 = vmovmskps_avx(auVar32);
      uVar21 = 0;
      for (; (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x80000000) {
        uVar21 = uVar21 + 1;
      }
      iVar22 = 1 << ((uint)k & 0x1f);
      auVar26._4_4_ = iVar22;
      auVar26._0_4_ = iVar22;
      auVar26._8_4_ = iVar22;
      auVar26._12_4_ = iVar22;
      auVar26._16_4_ = iVar22;
      auVar26._20_4_ = iVar22;
      auVar26._24_4_ = iVar22;
      auVar26._28_4_ = iVar22;
      auVar28 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
      auVar32 = vpand_avx2(auVar26,auVar28);
      auVar32 = vpcmpeqd_avx2(auVar32,auVar28);
      auVar59 = ZEXT3264(auVar32);
      do {
        local_430.hit = (RTCHitN *)&local_180;
        local_430.valid = (int *)local_3c0;
        auVar69 = auVar70._0_32_;
        auVar57 = auVar68._0_32_;
        auVar28 = auVar67._0_32_;
        auVar65 = auVar66._0_28_;
        auVar62 = auVar64._0_28_;
        auVar32 = auVar61._0_32_;
        auVar43 = ZEXT436(auVar39._28_4_);
        uVar24 = (ulong)uVar21;
        local_c0 = local_1a0[uVar24];
        pGVar5 = (pSVar23->geometries).items[local_c0].ptr;
        local_430.ray = (RTCRayN *)ray;
        if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
          *(undefined4 *)(local_400 + uVar24 * 4) = 0;
          auVar43 = ZEXT436(auVar39._28_4_);
        }
        else {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
            auVar56 = ZEXT464(*(uint *)(local_340 + uVar24 * 4));
            *(uint *)(ray + k * 4 + 0x100) = *(uint *)(local_340 + uVar24 * 4);
            *(undefined4 *)(ray + k * 4 + 0x180) = *(undefined4 *)(local_320 + uVar24 * 4);
            *(undefined4 *)(ray + k * 4 + 0x1a0) = *(undefined4 *)(local_300 + uVar24 * 4);
            *(undefined4 *)(ray + k * 4 + 0x1c0) = *(undefined4 *)(local_2e0 + uVar24 * 4);
            *(undefined4 *)(ray + k * 4 + 0x1e0) = 0;
            *(undefined4 *)(ray + k * 4 + 0x200) = 0;
            *(uint *)(ray + k * 4 + 0x220) = (sphere->primIDs).field_0.i[uVar24];
            *(uint *)(ray + k * 4 + 0x240) = local_c0;
            *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
            *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
LAB_0129fde9:
            auVar13 = vpand_avx(local_1b0,local_3d0);
            uVar35 = auVar56._0_4_;
            auVar33._4_4_ = uVar35;
            auVar33._0_4_ = uVar35;
            auVar33._8_4_ = uVar35;
            auVar33._12_4_ = uVar35;
            auVar33._16_4_ = uVar35;
            auVar33._20_4_ = uVar35;
            auVar33._24_4_ = uVar35;
            auVar33._28_4_ = uVar35;
            local_340 = auVar54._0_32_;
            auVar39 = vcmpps_avx(local_340,auVar33,2);
            auVar40 = vpackssdw_avx(auVar39._0_16_,auVar39._16_16_);
            auVar40 = vpand_avx(auVar40,auVar13);
            auVar39 = vpmovzxwd_avx2(auVar40);
            auVar39 = vpslld_avx2(auVar39,0x1f);
            if ((((((((auVar39 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar39 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar39 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar39 >> 0x7f,0) == '\0') &&
                  (auVar39 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar39 >> 0xbf,0) == '\0') &&
                (auVar39 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar39[0x1f]) {
              return;
            }
            local_400 = vpsrad_avx2(auVar39,0x1f);
            fVar1 = auVar52._0_4_;
            auVar61._0_4_ = auVar32._0_4_ * fVar1;
            fVar2 = auVar52._4_4_;
            auVar61._4_4_ = auVar32._4_4_ * fVar2;
            fVar3 = auVar52._8_4_;
            auVar61._8_4_ = auVar32._8_4_ * fVar3;
            fVar44 = auVar52._12_4_;
            auVar61._12_4_ = auVar32._12_4_ * fVar44;
            fVar47 = auVar52._16_4_;
            auVar61._16_4_ = auVar32._16_4_ * fVar47;
            fVar48 = auVar52._20_4_;
            auVar61._20_4_ = auVar32._20_4_ * fVar48;
            fVar49 = auVar52._24_4_;
            auVar61._24_4_ = auVar32._24_4_ * fVar49;
            auVar61._28_36_ = auVar43;
            auVar64._0_4_ = auVar62._0_4_ * fVar1;
            auVar64._4_4_ = auVar62._4_4_ * fVar2;
            auVar64._8_4_ = auVar62._8_4_ * fVar3;
            auVar64._12_4_ = auVar62._12_4_ * fVar44;
            auVar64._16_4_ = auVar62._16_4_ * fVar47;
            auVar64._20_4_ = auVar62._20_4_ * fVar48;
            auVar64._28_36_ = auVar46._28_36_;
            auVar64._24_4_ = auVar62._24_4_ * fVar49;
            auVar66._0_4_ = auVar65._0_4_ * fVar1;
            auVar66._4_4_ = auVar65._4_4_ * fVar2;
            auVar66._8_4_ = auVar65._8_4_ * fVar3;
            auVar66._12_4_ = auVar65._12_4_ * fVar44;
            auVar66._16_4_ = auVar65._16_4_ * fVar47;
            auVar66._20_4_ = auVar65._20_4_ * fVar48;
            auVar66._28_36_ = auVar52._28_36_;
            auVar66._24_4_ = auVar65._24_4_ * fVar49;
            local_320 = vsubps_avx(auVar61._0_32_,auVar28);
            local_300 = vsubps_avx(auVar64._0_32_,auVar57);
            local_2e0 = vsubps_avx(auVar66._0_32_,auVar69);
            pSVar23 = context->scene;
            auVar28 = vblendvps_avx(auVar58._0_32_,local_340,auVar39);
            auVar57 = vshufps_avx(auVar28,auVar28,0xb1);
            auVar57 = vminps_avx(auVar28,auVar57);
            auVar39 = vshufpd_avx(auVar57,auVar57,5);
            auVar57 = vminps_avx(auVar57,auVar39);
            auVar39 = vpermpd_avx2(auVar57,0x4e);
            auVar57 = vminps_avx(auVar57,auVar39);
            auVar28 = vcmpps_avx(auVar28,auVar57,0);
            auVar13 = vpackssdw_avx(auVar28._0_16_,auVar28._16_16_);
            auVar40 = vpand_avx(auVar13,auVar40);
            auVar28 = vpmovzxwd_avx2(auVar40);
            auVar28 = vpslld_avx2(auVar28,0x1f);
            if ((((((((auVar28 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar28 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar28 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar28 >> 0x7f,0) == '\0') &&
                  (auVar28 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar28 >> 0xbf,0) == '\0') &&
                (auVar28 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar28[0x1f]) {
              auVar28 = local_400;
            }
            uVar20 = vmovmskps_avx(auVar28);
            uVar21 = 0;
            for (; (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x80000000) {
              uVar21 = uVar21 + 1;
            }
            auVar68 = ZEXT864(0) << 0x20;
            auVar32 = vpcmpeqd_avx2(auVar32,auVar32);
            auVar70 = ZEXT3264(auVar32);
            do {
              local_430.hit = (RTCHitN *)&local_180;
              local_430.valid = (int *)local_3c0;
              uVar24 = (ulong)uVar21;
              local_c0 = local_1a0[uVar24];
              pGVar5 = (pSVar23->geometries).items[local_c0].ptr;
              if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                *(undefined4 *)(local_400 + uVar24 * 4) = 0;
              }
              else {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_340 + uVar24 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x180) = *(undefined4 *)(local_320 + uVar24 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x1a0) = *(undefined4 *)(local_300 + uVar24 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x1c0) = *(undefined4 *)(local_2e0 + uVar24 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x1e0) = 0;
                  *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                  *(uint *)(ray + k * 4 + 0x220) = (sphere->primIDs).field_0.i[uVar24];
                  *(uint *)(ray + k * 4 + 0x240) = local_c0;
                  *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                  return;
                }
                local_e0 = (sphere->primIDs).field_0.i[uVar24];
                local_180 = *(undefined4 *)(local_320 + uVar24 * 4);
                local_160._4_4_ = *(undefined4 *)(local_300 + uVar24 * 4);
                uVar35 = *(undefined4 *)(local_2e0 + uVar24 * 4);
                local_140._4_4_ = uVar35;
                local_140._0_4_ = uVar35;
                local_140._8_4_ = uVar35;
                local_140._12_4_ = uVar35;
                local_140._16_4_ = uVar35;
                local_140._20_4_ = uVar35;
                local_140._24_4_ = uVar35;
                local_140._28_4_ = uVar35;
                uStack_17c = local_180;
                uStack_178 = local_180;
                uStack_174 = local_180;
                uStack_170 = local_180;
                uStack_16c = local_180;
                uStack_168 = local_180;
                uStack_164 = local_180;
                local_160._0_4_ = local_160._4_4_;
                local_160._8_4_ = local_160._4_4_;
                local_160._12_4_ = local_160._4_4_;
                local_160._16_4_ = local_160._4_4_;
                local_160._20_4_ = local_160._4_4_;
                local_160._24_4_ = local_160._4_4_;
                local_160._28_4_ = local_160._4_4_;
                local_100 = auVar68._0_32_;
                local_120 = auVar68._0_32_;
                uStack_dc = local_e0;
                uStack_d8 = local_e0;
                uStack_d4 = local_e0;
                uStack_d0 = local_e0;
                uStack_cc = local_e0;
                uStack_c8 = local_e0;
                uStack_c4 = local_e0;
                uStack_bc = local_c0;
                uStack_b8 = local_c0;
                uStack_b4 = local_c0;
                uStack_b0 = local_c0;
                uStack_ac = local_c0;
                uStack_a8 = local_c0;
                uStack_a4 = local_c0;
                uStack_9c = context->user->instID[0];
                local_a0 = uStack_9c;
                uStack_98 = uStack_9c;
                uStack_94 = uStack_9c;
                uStack_90 = uStack_9c;
                uStack_8c = uStack_9c;
                uStack_88 = uStack_9c;
                uStack_84 = uStack_9c;
                uStack_7c = context->user->instPrimID[0];
                local_80 = uStack_7c;
                uStack_78 = uStack_7c;
                uStack_74 = uStack_7c;
                uStack_70 = uStack_7c;
                uStack_6c = uStack_7c;
                uStack_68 = uStack_7c;
                uStack_64 = uStack_7c;
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_340 + uVar24 * 4);
                local_3c0 = auVar59._0_32_;
                local_430.geometryUserPtr = pGVar5->userPtr;
                local_430.context = context->user;
                local_430.N = 8;
                local_430.ray = (RTCRayN *)ray;
                if (pGVar5->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                  local_360 = auVar54._0_32_;
                  local_380 = auVar56._0_32_;
                  local_3d0._0_8_ = pSVar23;
                  auVar32 = ZEXT1632(auVar70._0_16_);
                  local_3a0 = local_3c0;
                  (*pGVar5->intersectionFilterN)(&local_430);
                  auVar32 = vpcmpeqd_avx2(auVar32,auVar32);
                  auVar70 = ZEXT3264(auVar32);
                  auVar68 = ZEXT1664(ZEXT816(0) << 0x40);
                  auVar59 = ZEXT3264(local_3a0);
                  auVar56 = ZEXT3264(local_380);
                  auVar54 = ZEXT3264(local_360);
                  pSVar23 = (Scene *)local_3d0._0_8_;
                }
                auVar28 = vpcmpeqd_avx2(local_3c0,auVar68._0_32_);
                auVar32 = auVar70._0_32_ & ~auVar28;
                if ((((((((auVar32 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar32 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar32 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar32 >> 0x7f,0) == '\0') &&
                      (auVar32 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar32 >> 0xbf,0) == '\0') &&
                    (auVar32 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar32[0x1f]) {
                  auVar28 = auVar70._0_32_ ^ auVar28;
                  auVar58 = ZEXT3264(CONCAT428(0x7f800000,
                                               CONCAT424(0x7f800000,
                                                         CONCAT420(0x7f800000,
                                                                   CONCAT416(0x7f800000,
                                                                             CONCAT412(0x7f800000,
                                                                                       CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
                }
                else {
                  p_Var8 = context->args->filter;
                  if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar5->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    local_360 = auVar54._0_32_;
                    local_380 = auVar56._0_32_;
                    local_3a0 = auVar59._0_32_;
                    local_3d0._0_8_ = pSVar23;
                    auVar32 = ZEXT1632(auVar70._0_16_);
                    (*p_Var8)(&local_430);
                    auVar32 = vpcmpeqd_avx2(auVar32,auVar32);
                    auVar70 = ZEXT3264(auVar32);
                    auVar68 = ZEXT1664(ZEXT816(0) << 0x40);
                    auVar59 = ZEXT3264(local_3a0);
                    auVar56 = ZEXT3264(local_380);
                    auVar54 = ZEXT3264(local_360);
                    pSVar23 = (Scene *)local_3d0._0_8_;
                  }
                  auVar57 = vpcmpeqd_avx2(local_3c0,auVar68._0_32_);
                  auVar28 = auVar70._0_32_ ^ auVar57;
                  auVar32 = auVar70._0_32_ & ~auVar57;
                  auVar58 = ZEXT3264(CONCAT428(0x7f800000,
                                               CONCAT424(0x7f800000,
                                                         CONCAT420(0x7f800000,
                                                                   CONCAT416(0x7f800000,
                                                                             CONCAT412(0x7f800000,
                                                                                       CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
                  if ((((((((auVar32 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar32 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar32 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar32 >> 0x7f,0) != '\0') ||
                        (auVar32 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar32 >> 0xbf,0) != '\0') ||
                      (auVar32 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar32[0x1f] < '\0') {
                    auVar34._0_4_ = auVar70._0_4_ ^ auVar57._0_4_;
                    auVar34._4_4_ = auVar70._4_4_ ^ auVar57._4_4_;
                    auVar34._8_4_ = auVar70._8_4_ ^ auVar57._8_4_;
                    auVar34._12_4_ = auVar70._12_4_ ^ auVar57._12_4_;
                    auVar34._16_4_ = auVar70._16_4_ ^ auVar57._16_4_;
                    auVar34._20_4_ = auVar70._20_4_ ^ auVar57._20_4_;
                    auVar34._24_4_ = auVar70._24_4_ ^ auVar57._24_4_;
                    auVar34._28_4_ = auVar70._28_4_ ^ auVar57._28_4_;
                    auVar32 = vmaskmovps_avx(auVar34,*(undefined1 (*) [32])local_430.hit);
                    *(undefined1 (*) [32])(local_430.ray + 0x180) = auVar32;
                    auVar32 = vmaskmovps_avx(auVar34,*(undefined1 (*) [32])(local_430.hit + 0x20));
                    *(undefined1 (*) [32])(local_430.ray + 0x1a0) = auVar32;
                    auVar32 = vmaskmovps_avx(auVar34,*(undefined1 (*) [32])(local_430.hit + 0x40));
                    *(undefined1 (*) [32])(local_430.ray + 0x1c0) = auVar32;
                    auVar32 = vmaskmovps_avx(auVar34,*(undefined1 (*) [32])(local_430.hit + 0x60));
                    *(undefined1 (*) [32])(local_430.ray + 0x1e0) = auVar32;
                    auVar32 = vmaskmovps_avx(auVar34,*(undefined1 (*) [32])(local_430.hit + 0x80));
                    *(undefined1 (*) [32])(local_430.ray + 0x200) = auVar32;
                    auVar32 = vpmaskmovd_avx2(auVar34,*(undefined1 (*) [32])(local_430.hit + 0xa0));
                    *(undefined1 (*) [32])(local_430.ray + 0x220) = auVar32;
                    auVar32 = vpmaskmovd_avx2(auVar34,*(undefined1 (*) [32])(local_430.hit + 0xc0));
                    *(undefined1 (*) [32])(local_430.ray + 0x240) = auVar32;
                    auVar32 = vpmaskmovd_avx2(auVar34,*(undefined1 (*) [32])(local_430.hit + 0xe0));
                    *(undefined1 (*) [32])(local_430.ray + 0x260) = auVar32;
                    auVar32 = vpmaskmovd_avx2(auVar34,*(undefined1 (*) [32])(local_430.hit + 0x100))
                    ;
                    *(undefined1 (*) [32])(local_430.ray + 0x280) = auVar32;
                  }
                }
                if ((((((((auVar28 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar28 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar28 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar28 >> 0x7f,0) == '\0') &&
                      (auVar28 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar28 >> 0xbf,0) == '\0') &&
                    (auVar28 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar28[0x1f]) {
                  *(int *)(ray + k * 4 + 0x100) = auVar56._0_4_;
                }
                else {
                  auVar56 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
                }
                *(undefined4 *)(local_400 + uVar24 * 4) = 0;
                uVar35 = auVar56._0_4_;
                auVar29._4_4_ = uVar35;
                auVar29._0_4_ = uVar35;
                auVar29._8_4_ = uVar35;
                auVar29._12_4_ = uVar35;
                auVar29._16_4_ = uVar35;
                auVar29._20_4_ = uVar35;
                auVar29._24_4_ = uVar35;
                auVar29._28_4_ = uVar35;
                auVar32 = vcmpps_avx(auVar54._0_32_,auVar29,2);
                local_400 = vandps_avx(auVar32,local_400);
              }
              if ((((((((local_400 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (local_400 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (local_400 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(local_400 >> 0x7f,0) == '\0') &&
                    (local_400 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(local_400 >> 0xbf,0) == '\0') &&
                  (local_400 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < local_400[0x1f]) {
                return;
              }
              auVar32 = vblendvps_avx(auVar58._0_32_,auVar54._0_32_,local_400);
              auVar28 = vshufps_avx(auVar32,auVar32,0xb1);
              auVar28 = vminps_avx(auVar32,auVar28);
              auVar57 = vshufpd_avx(auVar28,auVar28,5);
              auVar28 = vminps_avx(auVar28,auVar57);
              auVar57 = vpermpd_avx2(auVar28,0x4e);
              auVar28 = vminps_avx(auVar28,auVar57);
              auVar28 = vcmpps_avx(auVar32,auVar28,0);
              auVar57 = local_400 & auVar28;
              auVar32 = local_400;
              if ((((((((auVar57 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar57 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar57 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar57 >> 0x7f,0) != '\0') ||
                    (auVar57 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar57 >> 0xbf,0) != '\0') ||
                  (auVar57 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar57[0x1f] < '\0') {
                auVar32 = vandps_avx(auVar28,local_400);
              }
              uVar20 = vmovmskps_avx(auVar32);
              uVar21 = 0;
              for (; (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x80000000) {
                uVar21 = uVar21 + 1;
              }
            } while( true );
          }
          local_1e0 = auVar46._0_32_;
          local_e0 = (sphere->primIDs).field_0.i[uVar24];
          local_180 = *(undefined4 *)(local_320 + uVar24 * 4);
          uVar35 = *(undefined4 *)(local_300 + uVar24 * 4);
          auVar40._4_4_ = uVar35;
          auVar40._0_4_ = uVar35;
          auVar40._8_4_ = uVar35;
          auVar40._12_4_ = uVar35;
          local_160._16_4_ = uVar35;
          local_160._0_16_ = auVar40;
          local_160._20_4_ = uVar35;
          local_160._24_4_ = uVar35;
          local_160._28_4_ = uVar35;
          auVar42 = ZEXT3264(local_160);
          local_140._4_4_ = *(undefined4 *)(local_2e0 + uVar24 * 4);
          uStack_17c = local_180;
          uStack_178 = local_180;
          uStack_174 = local_180;
          uStack_170 = local_180;
          uStack_16c = local_180;
          uStack_168 = local_180;
          uStack_164 = local_180;
          local_140._0_4_ = local_140._4_4_;
          local_140._8_4_ = local_140._4_4_;
          local_140._12_4_ = local_140._4_4_;
          local_140._16_4_ = local_140._4_4_;
          local_140._20_4_ = local_140._4_4_;
          local_140._24_4_ = local_140._4_4_;
          local_140._28_4_ = local_140._4_4_;
          local_100 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
          local_120 = local_100;
          uStack_dc = local_e0;
          uStack_d8 = local_e0;
          uStack_d4 = local_e0;
          uStack_d0 = local_e0;
          uStack_cc = local_e0;
          uStack_c8 = local_e0;
          uStack_c4 = local_e0;
          uStack_bc = local_c0;
          uStack_b8 = local_c0;
          uStack_b4 = local_c0;
          uStack_b0 = local_c0;
          uStack_ac = local_c0;
          uStack_a8 = local_c0;
          uStack_a4 = local_c0;
          auVar39 = vpcmpeqd_avx2(local_100,local_100);
          uStack_9c = context->user->instID[0];
          local_a0 = uStack_9c;
          uStack_98 = uStack_9c;
          uStack_94 = uStack_9c;
          uStack_90 = uStack_9c;
          uStack_8c = uStack_9c;
          uStack_88 = uStack_9c;
          uStack_84 = uStack_9c;
          uStack_7c = context->user->instPrimID[0];
          local_80 = uStack_7c;
          uStack_78 = uStack_7c;
          uStack_74 = uStack_7c;
          uStack_70 = uStack_7c;
          uStack_6c = uStack_7c;
          uStack_68 = uStack_7c;
          uStack_64 = uStack_7c;
          *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_340 + uVar24 * 4);
          local_3c0 = auVar59._0_32_;
          local_430.geometryUserPtr = pGVar5->userPtr;
          local_430.context = context->user;
          local_430.N = 8;
          if (pGVar5->intersectionFilterN != (RTCFilterFunctionN)0x0) {
            local_360 = auVar54._0_32_;
            local_380 = auVar56._0_32_;
            local_220 = auVar64._0_32_;
            local_240 = auVar66._0_32_;
            local_2c0 = auVar52._0_32_;
            auVar39 = ZEXT1632(auVar39._0_16_);
            auVar42 = ZEXT1664(auVar40);
            local_3a0 = local_3c0;
            local_2a0 = auVar69;
            local_280 = auVar57;
            local_260 = auVar28;
            local_200 = auVar32;
            (*pGVar5->intersectionFilterN)(&local_430);
            auVar39 = vpcmpeqd_avx2(auVar39,auVar39);
            auVar52 = ZEXT3264(local_2c0);
            auVar70 = ZEXT3264(local_2a0);
            auVar68 = ZEXT3264(local_280);
            auVar67 = ZEXT3264(local_260);
            auVar66 = ZEXT3264(local_240);
            auVar64 = ZEXT3264(local_220);
            auVar61 = ZEXT3264(local_200);
            auVar59 = ZEXT3264(local_3a0);
            auVar58 = ZEXT3264(CONCAT428(0x7f800000,
                                         CONCAT424(0x7f800000,
                                                   CONCAT420(0x7f800000,
                                                             CONCAT416(0x7f800000,
                                                                       CONCAT412(0x7f800000,
                                                                                 CONCAT48(0x7f800000
                                                                                          ,
                                                  0x7f8000007f800000)))))));
            auVar56 = ZEXT3264(local_380);
            auVar54 = ZEXT3264(local_360);
          }
          auVar57 = auVar42._0_32_;
          auVar28 = vpcmpeqd_avx2(local_3c0,_DAT_01f7b000);
          auVar32 = auVar39 & ~auVar28;
          if ((((((((auVar32 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar32 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar32 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar32 >> 0x7f,0) == '\0') &&
                (auVar32 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar32 >> 0xbf,0) == '\0') &&
              (auVar32 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar32[0x1f]) {
            auVar28 = auVar28 ^ auVar39;
            auVar46 = ZEXT3264(local_1e0);
          }
          else {
            p_Var8 = context->args->filter;
            auVar46 = ZEXT3264(local_1e0);
            if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
              local_360 = auVar54._0_32_;
              local_380 = auVar56._0_32_;
              local_3a0 = auVar59._0_32_;
              local_200 = auVar61._0_32_;
              local_220 = auVar64._0_32_;
              local_240 = auVar66._0_32_;
              local_260 = auVar67._0_32_;
              local_280 = auVar68._0_32_;
              local_2a0 = auVar70._0_32_;
              local_2c0 = auVar52._0_32_;
              auVar39 = ZEXT1632(auVar39._0_16_);
              auVar57 = ZEXT1632(auVar42._0_16_);
              (*p_Var8)(&local_430);
              auVar46 = ZEXT3264(local_1e0);
              auVar52 = ZEXT3264(local_2c0);
              auVar70 = ZEXT3264(local_2a0);
              auVar68 = ZEXT3264(local_280);
              auVar67 = ZEXT3264(local_260);
              auVar66 = ZEXT3264(local_240);
              auVar64 = ZEXT3264(local_220);
              auVar61 = ZEXT3264(local_200);
              auVar59 = ZEXT3264(local_3a0);
              auVar58 = ZEXT3264(CONCAT428(0x7f800000,
                                           CONCAT424(0x7f800000,
                                                     CONCAT420(0x7f800000,
                                                               CONCAT416(0x7f800000,
                                                                         CONCAT412(0x7f800000,
                                                                                   CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
              auVar56 = ZEXT3264(local_380);
              auVar54 = ZEXT3264(local_360);
            }
            auVar69 = vpcmpeqd_avx2(local_3c0,_DAT_01f7b000);
            auVar32 = vpcmpeqd_avx2(auVar57,auVar57);
            auVar42 = ZEXT3264(auVar32);
            auVar28 = auVar69 ^ auVar32;
            auVar57 = vpcmpeqd_avx2(auVar39,auVar39);
            auVar32 = auVar32 & ~auVar69;
            if ((((((((auVar32 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar32 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar32 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar32 >> 0x7f,0) != '\0') ||
                  (auVar32 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar32 >> 0xbf,0) != '\0') ||
                (auVar32 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar32[0x1f] < '\0') {
              auVar69 = auVar69 ^ auVar57;
              auVar32 = vmaskmovps_avx(auVar69,*(undefined1 (*) [32])local_430.hit);
              *(undefined1 (*) [32])(local_430.ray + 0x180) = auVar32;
              auVar32 = vmaskmovps_avx(auVar69,*(undefined1 (*) [32])(local_430.hit + 0x20));
              *(undefined1 (*) [32])(local_430.ray + 0x1a0) = auVar32;
              auVar32 = vmaskmovps_avx(auVar69,*(undefined1 (*) [32])(local_430.hit + 0x40));
              *(undefined1 (*) [32])(local_430.ray + 0x1c0) = auVar32;
              auVar32 = vmaskmovps_avx(auVar69,*(undefined1 (*) [32])(local_430.hit + 0x60));
              *(undefined1 (*) [32])(local_430.ray + 0x1e0) = auVar32;
              auVar32 = vmaskmovps_avx(auVar69,*(undefined1 (*) [32])(local_430.hit + 0x80));
              *(undefined1 (*) [32])(local_430.ray + 0x200) = auVar32;
              auVar32 = vpmaskmovd_avx2(auVar69,*(undefined1 (*) [32])(local_430.hit + 0xa0));
              *(undefined1 (*) [32])(local_430.ray + 0x220) = auVar32;
              auVar32 = vpmaskmovd_avx2(auVar69,*(undefined1 (*) [32])(local_430.hit + 0xc0));
              *(undefined1 (*) [32])(local_430.ray + 0x240) = auVar32;
              auVar32 = vpmaskmovd_avx2(auVar69,*(undefined1 (*) [32])(local_430.hit + 0xe0));
              *(undefined1 (*) [32])(local_430.ray + 0x260) = auVar32;
              auVar32 = vpmaskmovd_avx2(auVar69,*(undefined1 (*) [32])(local_430.hit + 0x100));
              *(undefined1 (*) [32])(local_430.ray + 0x280) = auVar32;
            }
          }
          if ((((((((auVar28 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar28 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar28 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar28 >> 0x7f,0) == '\0') &&
                (auVar28 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar28 >> 0xbf,0) == '\0') &&
              (auVar28 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar28[0x1f]) {
            *(int *)(ray + k * 4 + 0x100) = auVar56._0_4_;
          }
          else {
            auVar56 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
          }
          *(undefined4 *)(local_400 + uVar24 * 4) = 0;
          uVar35 = auVar56._0_4_;
          auVar27._4_4_ = uVar35;
          auVar27._0_4_ = uVar35;
          auVar27._8_4_ = uVar35;
          auVar27._12_4_ = uVar35;
          auVar27._16_4_ = uVar35;
          auVar27._20_4_ = uVar35;
          auVar27._24_4_ = uVar35;
          auVar27._28_4_ = uVar35;
          auVar32 = vcmpps_avx(auVar46._0_32_,auVar27,2);
          local_400 = vandps_avx(auVar32,local_400);
          auVar43 = auVar42._28_36_;
        }
        auVar69 = auVar70._0_32_;
        auVar57 = auVar68._0_32_;
        auVar28 = auVar67._0_32_;
        auVar65 = auVar66._0_28_;
        auVar62 = auVar64._0_28_;
        auVar32 = auVar61._0_32_;
        if ((((((((local_400 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (local_400 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (local_400 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(local_400 >> 0x7f,0) == '\0') &&
              (local_400 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(local_400 >> 0xbf,0) == '\0') &&
            (local_400 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < local_400[0x1f]) goto LAB_0129fde9;
        auVar32 = vblendvps_avx(auVar58._0_32_,auVar46._0_32_,local_400);
        auVar28 = vshufps_avx(auVar32,auVar32,0xb1);
        auVar28 = vminps_avx(auVar32,auVar28);
        auVar57 = vshufpd_avx(auVar28,auVar28,5);
        auVar28 = vminps_avx(auVar28,auVar57);
        auVar39 = vpermpd_avx2(auVar28,0x4e);
        auVar28 = vminps_avx(auVar28,auVar39);
        auVar28 = vcmpps_avx(auVar32,auVar28,0);
        auVar57 = local_400 & auVar28;
        auVar32 = local_400;
        if ((((((((auVar57 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar57 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar57 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar57 >> 0x7f,0) != '\0') ||
              (auVar57 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar57 >> 0xbf,0) != '\0') ||
            (auVar57 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar57[0x1f] < '\0') {
          auVar32 = vandps_avx(auVar28,local_400);
        }
        uVar20 = vmovmskps_avx(auVar32);
        uVar21 = 0;
        for (; (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x80000000) {
          uVar21 = uVar21 + 1;
        }
      } while( true );
    }
  }
  return;
}

Assistant:

static __forceinline void intersect(
          const Precalculations& pre, RayHitK<K>& ray, size_t k, RayQueryContext* context, const Primitive& sphere)
      {
        STAT3(normal.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(sphere.geomID());
        Vec4vf<M> v0; sphere.gather(v0, geom);
        const vbool<M> valid = sphere.valid();
        SphereIntersectorK<M, K>::intersect(
          valid, ray, k, context, geom, pre, v0,
          Intersect1KEpilogM<M, K, filter>(ray, k, context, sphere.geomID(), sphere.primID()));
      }